

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceptiveFieldDecodingSynapse.cpp
# Opt level: O0

void __thiscall ReceptiveFieldDecodingSynapse::update(ReceptiveFieldDecodingSynapse *this)

{
  Index IVar1;
  Scalar *pSVar2;
  reference ppEVar3;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *in_RDI;
  Scalar *val;
  double dVar4;
  double outputValue;
  int j;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_ffffffffffffffc0;
  Logging *in_stack_ffffffffffffffe0;
  int local_14;
  
  val = (Scalar *)(*(double *)(in_RDI + 0x40) + **(double **)(in_RDI + 0x18));
  dVar4 = Clock::getCurrentTime(*(Clock **)(in_RDI + 0x50));
  if ((double)val <= dVar4) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_ffffffffffffffe0,val);
    *(double *)(in_RDI + 0x40) = **(double **)(in_RDI + 0x18) + *(double *)(in_RDI + 0x40);
    in_RDI[0x48] = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>)0x0;
  }
  local_14 = 0;
  while( true ) {
    dVar4 = (double)(long)local_14;
    IVar1 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                      (in_stack_ffffffffffffffc0);
    if (IVar1 <= (long)dVar4) break;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       (in_RDI,(Index)dVar4);
    if (*pSVar2 <= 0.0 && *pSVar2 != 0.0) {
      ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                          ((vector<Event_*,_std::allocator<Event_*>_> *)(*(long *)(in_RDI + 8) + 8),
                           (long)local_14);
      if (((*ppEVar3)->type == Spike) && (((byte)in_RDI[0x48] & 1) == 0)) {
        in_stack_ffffffffffffffe0 = (Logging *)((double)local_14 * *(double *)(in_RDI + 0x38));
        ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),0);
        ValueEvent::setValue((ValueEvent *)*ppEVar3,(double)in_stack_ffffffffffffffe0);
        in_stack_ffffffffffffffc0 =
             *(EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> **)(in_RDI + 0x10);
        ppEVar3 = std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
                            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),0);
        (**(code **)(*(long *)in_stack_ffffffffffffffc0 + 0x28))
                  (in_stack_ffffffffffffffc0,0,*ppEVar3);
        in_RDI[0x48] = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>)0x1;
      }
    }
    local_14 = local_14 + 1;
  }
  std::vector<Event_*,_std::allocator<Event_*>_>::operator[]
            ((vector<Event_*,_std::allocator<Event_*>_> *)(in_RDI + 0x60),0);
  Logging::logValue(in_stack_ffffffffffffffe0,(long)val,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                    dVar4);
  return;
}

Assistant:

void ReceptiveFieldDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
        earliestSpike = false;
    }
    for(int j = 0; j < spikeTimes.size(); j++) {
        if(spikeTimes(j) < 0 && from_population->output[j]->type == EventType::Spike && !earliestSpike) {
            double outputValue = j * outputStep;
            static_cast<ValueEvent*>(output[0])->setValue(outputValue);
            to_population->setInput(0, output[0]);
            earliestSpike = true;
        }
    }
    logger->logValue((long)this, 0, EventType::Value, static_cast<ValueEvent*>(output[0])->value);
}